

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AnsiUdpPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AnsiUdpPortListSyntax,slang::syntax::AnsiUdpPortListSyntax_const&>
          (BumpAllocator *this,AnsiUdpPortListSyntax *args)

{
  AnsiUdpPortListSyntax *pAVar1;
  AnsiUdpPortListSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pAVar1 = (AnsiUdpPortListSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::AnsiUdpPortListSyntax::AnsiUdpPortListSyntax(in_RSI,pAVar1);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }